

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O2

REF_STATUS ref_clump_between(REF_GRID_conflict ref_grid,REF_INT node0,REF_INT node1,char *filename)

{
  REF_CELL pRVar1;
  REF_ADJ pRVar2;
  uint uVar3;
  int iVar4;
  REF_ADJ_ITEM pRVar5;
  FILE *__s;
  undefined8 uVar6;
  ulong uVar7;
  char *pcVar8;
  ulong uVar9;
  REF_INT RVar10;
  long lVar11;
  int iVar12;
  REF_DICT node_dict;
  uint local_e4;
  REF_DICT local_e0;
  REF_GRID_conflict local_d8;
  REF_DICT tet_dict;
  REF_DICT tri_dict;
  ulong local_c0;
  char *local_b8;
  ulong local_b0;
  REF_INT nodes [27];
  
  uVar7 = (ulong)(uint)node0;
  uVar3 = ref_dict_create(&node_dict);
  if (uVar3 == 0) {
    uVar3 = ref_dict_create(&tri_dict);
    if (uVar3 == 0) {
      uVar3 = ref_dict_create(&tet_dict);
      if (uVar3 == 0) {
        pRVar1 = ref_grid->cell[3];
        uVar9 = 0xffffffff;
        RVar10 = -1;
        if (-1 < node0) {
          pRVar2 = pRVar1->ref_adj;
          uVar9 = 0xffffffff;
          RVar10 = -1;
          if (node0 < pRVar2->nnode) {
            uVar3 = pRVar2->first[uVar7];
            uVar9 = 0xffffffff;
            RVar10 = -1;
            if ((long)(int)uVar3 != -1) {
              RVar10 = pRVar2->item[(int)uVar3].ref;
              uVar9 = (ulong)uVar3;
            }
          }
        }
        local_e0 = tri_dict;
        local_e4 = node0;
        local_d8 = ref_grid;
        local_b8 = filename;
        local_b0 = uVar7;
        while( true ) {
          if ((int)uVar9 == -1) {
            local_c0 = (ulong)(uint)node1;
            RVar10 = -1;
            iVar4 = -1;
            if (node1 < 0) goto LAB_001f1f79;
            pRVar2 = pRVar1->ref_adj;
            RVar10 = -1;
            if (pRVar2->nnode <= node1) goto LAB_001f1f79;
            iVar12 = pRVar2->first[local_c0];
            RVar10 = -1;
            if (iVar12 == -1) goto LAB_001f1f79;
            pRVar5 = pRVar2->item;
            do {
              RVar10 = pRVar5[iVar12].ref;
              iVar4 = iVar12;
LAB_001f1f79:
              iVar12 = iVar4;
              do {
                if (iVar12 == -1) {
                  pRVar1 = local_d8->cell[8];
                  uVar9 = 0xffffffff;
                  RVar10 = -1;
                  if (-1 < (int)uVar7) {
                    pRVar2 = pRVar1->ref_adj;
                    uVar9 = 0xffffffff;
                    RVar10 = -1;
                    if ((int)uVar7 < pRVar2->nnode) {
                      uVar3 = pRVar2->first[local_b0];
                      uVar9 = 0xffffffff;
                      RVar10 = -1;
                      if ((long)(int)uVar3 != -1) {
                        RVar10 = pRVar2->item[(int)uVar3].ref;
                        uVar9 = (ulong)uVar3;
                      }
                    }
                  }
                  local_e0 = tet_dict;
                  goto LAB_001f20cf;
                }
                uVar3 = ref_cell_nodes(pRVar1,RVar10,nodes);
                if (uVar3 != 0) {
                  uVar7 = (ulong)uVar3;
                  pcVar8 = "n";
                  uVar6 = 0xd0;
                  goto LAB_001f1f0c;
                }
                uVar3 = ref_dict_store(local_e0,RVar10,0);
                if (uVar3 != 0) {
                  uVar7 = (ulong)uVar3;
                  pcVar8 = "store";
                  uVar6 = 0xd1;
                  goto LAB_001f1f0c;
                }
                lVar11 = 0;
                while (lVar11 < pRVar1->node_per) {
                  uVar3 = ref_dict_store(node_dict,nodes[lVar11],0);
                  lVar11 = lVar11 + 1;
                  if (uVar3 != 0) {
                    uVar7 = (ulong)uVar3;
                    pcVar8 = "store";
                    uVar6 = 0xd3;
                    goto LAB_001f1f0c;
                  }
                }
                pRVar5 = pRVar1->ref_adj->item;
                iVar12 = pRVar5[iVar12].next;
                RVar10 = -1;
              } while (iVar12 == -1);
            } while( true );
          }
          uVar3 = ref_cell_nodes(pRVar1,RVar10,nodes);
          if (uVar3 != 0) break;
          uVar3 = ref_dict_store(local_e0,RVar10,0);
          if (uVar3 != 0) {
            uVar7 = (ulong)uVar3;
            pcVar8 = "store";
            uVar6 = 0xcb;
            goto LAB_001f1f0c;
          }
          lVar11 = 0;
          while (lVar11 < pRVar1->node_per) {
            uVar3 = ref_dict_store(node_dict,nodes[lVar11],0);
            lVar11 = lVar11 + 1;
            if (uVar3 != 0) {
              uVar7 = (ulong)uVar3;
              pcVar8 = "store";
              uVar6 = 0xcd;
              goto LAB_001f1f0c;
            }
          }
          pRVar5 = pRVar1->ref_adj->item;
          uVar9 = (ulong)pRVar5[(int)uVar9].next;
          uVar7 = (ulong)local_e4;
          RVar10 = -1;
          if (uVar9 != 0xffffffffffffffff) {
            RVar10 = pRVar5[uVar9].ref;
          }
        }
        uVar7 = (ulong)uVar3;
        pcVar8 = "n";
        uVar6 = 0xca;
      }
      else {
        uVar7 = (ulong)uVar3;
        pcVar8 = "create tets";
        uVar6 = 0xc5;
      }
    }
    else {
      uVar7 = (ulong)uVar3;
      pcVar8 = "create tris";
      uVar6 = 0xc4;
    }
  }
  else {
    uVar7 = (ulong)uVar3;
    pcVar8 = "create nodes";
    uVar6 = 0xc3;
  }
LAB_001f1f0c:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar6,
         "ref_clump_between",uVar7,pcVar8);
  return (REF_STATUS)uVar7;
LAB_001f20cf:
  if ((int)uVar9 == -1) {
    iVar4 = -1;
    RVar10 = -1;
    if (node1 < 0) goto LAB_001f220e;
    pRVar2 = pRVar1->ref_adj;
    RVar10 = -1;
    if (pRVar2->nnode <= node1) goto LAB_001f220e;
    iVar12 = pRVar2->first[local_c0];
    RVar10 = -1;
    if (iVar12 == -1) goto LAB_001f220e;
    pRVar5 = pRVar2->item;
    do {
      RVar10 = pRVar5[iVar12].ref;
      iVar4 = iVar12;
LAB_001f220e:
      iVar12 = iVar4;
      do {
        if (iVar12 == -1) {
          __s = fopen(local_b8,"w");
          if (__s == (FILE *)0x0) {
            printf("unable to open %s\n",local_b8);
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c"
                   ,0xe6,"ref_clump_between","unable to open file");
            return 2;
          }
          fwrite("title=\"tecplot refine clump file\"\n",0x22,1,__s);
          fwrite("variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n",0x2b,1,__s);
          uVar3 = ref_clump_zone_around
                            ((FILE *)__s,local_d8->cell[3],tri_dict,"fetriangle",node_dict,
                             local_d8->node,local_e4);
          if (uVar3 == 0) {
            uVar3 = ref_clump_zone_around
                              ((FILE *)__s,local_d8->cell[8],tet_dict,"fetetrahedron",node_dict,
                               local_d8->node,local_e4);
            if (uVar3 == 0) {
              fclose(__s);
              uVar3 = ref_dict_free(tet_dict);
              if (uVar3 == 0) {
                uVar3 = ref_dict_free(tri_dict);
                if (uVar3 == 0) {
                  uVar3 = ref_dict_free(node_dict);
                  if (uVar3 == 0) {
                    return 0;
                  }
                  uVar7 = (ulong)uVar3;
                  pcVar8 = "free nodes";
                  uVar6 = 0xfd;
                }
                else {
                  uVar7 = (ulong)uVar3;
                  pcVar8 = "free tris";
                  uVar6 = 0xfc;
                }
              }
              else {
                uVar7 = (ulong)uVar3;
                pcVar8 = "free tet";
                uVar6 = 0xfb;
              }
            }
            else {
              uVar7 = (ulong)uVar3;
              pcVar8 = "zone";
              uVar6 = 0xf7;
            }
          }
          else {
            uVar7 = (ulong)uVar3;
            pcVar8 = "zone";
            uVar6 = 0xf0;
          }
          goto LAB_001f1f0c;
        }
        uVar3 = ref_cell_nodes(pRVar1,RVar10,nodes);
        if (uVar3 != 0) {
          uVar7 = (ulong)uVar3;
          pcVar8 = "n";
          uVar6 = 0xde;
          goto LAB_001f1f0c;
        }
        uVar3 = ref_dict_store(local_e0,RVar10,0);
        if (uVar3 != 0) {
          uVar7 = (ulong)uVar3;
          pcVar8 = "store";
          uVar6 = 0xdf;
          goto LAB_001f1f0c;
        }
        lVar11 = 0;
        while (lVar11 < pRVar1->node_per) {
          uVar3 = ref_dict_store(node_dict,nodes[lVar11],0);
          lVar11 = lVar11 + 1;
          if (uVar3 != 0) {
            uVar7 = (ulong)uVar3;
            pcVar8 = "store";
            uVar6 = 0xe1;
            goto LAB_001f1f0c;
          }
        }
        pRVar5 = pRVar1->ref_adj->item;
        iVar12 = pRVar5[iVar12].next;
        RVar10 = -1;
      } while (iVar12 == -1);
    } while( true );
  }
  uVar3 = ref_cell_nodes(pRVar1,RVar10,nodes);
  if (uVar3 != 0) {
    uVar7 = (ulong)uVar3;
    pcVar8 = "n";
    uVar6 = 0xd8;
    goto LAB_001f1f0c;
  }
  uVar3 = ref_dict_store(local_e0,RVar10,0);
  if (uVar3 != 0) {
    uVar7 = (ulong)uVar3;
    pcVar8 = "store";
    uVar6 = 0xd9;
    goto LAB_001f1f0c;
  }
  lVar11 = 0;
  while (lVar11 < pRVar1->node_per) {
    uVar3 = ref_dict_store(node_dict,nodes[lVar11],0);
    lVar11 = lVar11 + 1;
    if (uVar3 != 0) {
      uVar7 = (ulong)uVar3;
      pcVar8 = "store";
      uVar6 = 0xdb;
      goto LAB_001f1f0c;
    }
  }
  pRVar5 = pRVar1->ref_adj->item;
  uVar9 = (ulong)pRVar5[(int)uVar9].next;
  RVar10 = -1;
  if (uVar9 != 0xffffffffffffffff) {
    RVar10 = pRVar5[uVar9].ref;
  }
  goto LAB_001f20cf;
}

Assistant:

REF_FCN REF_STATUS ref_clump_between(REF_GRID ref_grid, REF_INT node0,
                                     REF_INT node1, const char *filename) {
  REF_DICT node_dict, tri_dict, tet_dict;
  REF_DICT ref_dict;
  REF_CELL ref_cell;
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  const char *zonetype;

  FILE *f;

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&tri_dict), "create tris");
  RSS(ref_dict_create(&tet_dict), "create tets");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }
  each_ref_cell_having_node(ref_cell, node1, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(ref_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\" \"xm\" \"ym\" \"zm\" \"g\"\n");

  ref_cell = ref_grid_tri(ref_grid);
  ref_dict = tri_dict;
  zonetype = "fetriangle";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node0),
      "zone");

  ref_cell = ref_grid_tet(ref_grid);
  ref_dict = tet_dict;
  zonetype = "fetetrahedron";
  RSS(ref_clump_zone_around(f, ref_cell, ref_dict, zonetype, node_dict,
                            ref_grid_node(ref_grid), node0),
      "zone");

  fclose(f);

  RSS(ref_dict_free(tet_dict), "free tet");
  RSS(ref_dict_free(tri_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  return REF_SUCCESS;
}